

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixTruncate(sqlite3_file *id,i64 nByte)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  sqlite3_io_methods *psVar5;
  long lVar6;
  
  uVar1 = *(uint *)&id[9].pMethods;
  if (0 < (int)uVar1) {
    lVar6 = nByte + (ulong)uVar1 + -1;
    nByte = lVar6 - lVar6 % (long)(ulong)uVar1;
  }
  uVar1 = *(uint *)&id[3].pMethods;
  do {
    iVar2 = (*aSyscall[6].pCurrent)((ulong)uVar1,nByte);
    if (-1 < iVar2) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (iVar2 == 0) {
    iVar2 = 0;
    if (nByte < (long)id[10].pMethods) {
      id[10].pMethods = (sqlite3_io_methods *)nByte;
    }
  }
  else {
    puVar4 = (uint *)__errno_location();
    *(uint *)&id[4].pMethods = *puVar4;
    psVar5 = id[7].pMethods;
    if (psVar5 == (sqlite3_io_methods *)0x0) {
      psVar5 = (sqlite3_io_methods *)0x1a4219;
    }
    iVar2 = 0x60a;
    sqlite3_log(0x60a,"os_unix.c:%d: (%d) %s(%s) - %s",0x996e,(ulong)*puVar4,"ftruncate",psVar5,"");
  }
  return iVar2;
}

Assistant:

static int unixTruncate(sqlite3_file *id, i64 nByte){
  unixFile *pFile = (unixFile *)id;
  int rc;
  assert( pFile );
  SimulateIOError( return SQLITE_IOERR_TRUNCATE );

  /* If the user has configured a chunk-size for this file, truncate the
  ** file so that it consists of an integer number of chunks (i.e. the
  ** actual file size after the operation may be larger than the requested
  ** size).
  */
  if( pFile->szChunk>0 ){
    nByte = ((nByte + pFile->szChunk - 1)/pFile->szChunk) * pFile->szChunk;
  }

  rc = robust_ftruncate(pFile->h, nByte);
  if( rc ){
    storeLastErrno(pFile, errno);
    return unixLogError(SQLITE_IOERR_TRUNCATE, "ftruncate", pFile->zPath);
  }else{
#ifdef SQLITE_DEBUG
    /* If we are doing a normal write to a database file (as opposed to
    ** doing a hot-journal rollback or a write to some file other than a
    ** normal database file) and we truncate the file to zero length,
    ** that effectively updates the change counter.  This might happen
    ** when restoring a database using the backup API from a zero-length
    ** source.
    */
    if( pFile->inNormalWrite && nByte==0 ){
      pFile->transCntrChng = 1;
    }
#endif

#if SQLITE_MAX_MMAP_SIZE>0
    /* If the file was just truncated to a size smaller than the currently
    ** mapped region, reduce the effective mapping size as well. SQLite will
    ** use read() and write() to access data beyond this point from now on.
    */
    if( nByte<pFile->mmapSize ){
      pFile->mmapSize = nByte;
    }
#endif

    return SQLITE_OK;
  }
}